

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

CSampleHandle __thiscall CSound::LoadWV(CSound *this,char *pFilename)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  undefined4 extraout_var;
  WavpackContext *wpc;
  short *psVar6;
  undefined8 in_RSI;
  CSound *in_RDI;
  long in_FS_OFFSET;
  int i;
  short *pDst;
  int *pSrc;
  int *pData;
  int m_aChannels;
  uint SampleRate;
  int BitsPerSample;
  int m_aSamples;
  WavpackContext *pContext;
  int SampleID;
  CSample *pSample;
  char aError [100];
  int Index;
  ISound *this_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar7;
  WavpackContext *in_stack_ffffffffffffff30;
  undefined4 *local_c8;
  CSampleHandle local_7c;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_pConfig->m_DbgStress == 0) {
    if (in_RDI->m_SoundEnabled == 0) {
      ISound::CSampleHandle::CSampleHandle(&local_7c);
    }
    else if (in_RDI->m_pStorage == (IStorage *)0x0) {
      ISound::CSampleHandle::CSampleHandle(&local_7c);
    }
    else {
      lock_wait((LOCK)0x13e445);
      Index = 0;
      this_00 = (ISound *)0x0;
      iVar1 = (*(in_RDI->m_pStorage->super_IInterface)._vptr_IInterface[4])
                        (in_RDI->m_pStorage,in_RSI,1,0xffffffff,0,0);
      s_File = (IOHANDLE)CONCAT44(extraout_var,iVar1);
      if (s_File == (IOHANDLE)0x0) {
        dbg_msg("sound/wv","failed to open file. filename=\'%s\'",in_RSI);
        lock_unlock((LOCK)0x13e4b1);
        ISound::CSampleHandle::CSampleHandle(&local_7c);
      }
      else {
        iVar1 = AllocID(in_RDI);
        if (iVar1 < 0) {
          io_close((IOHANDLE)0x13e4e1);
          s_File = (IOHANDLE)0x0;
          lock_unlock((LOCK)0x13e4f8);
          ISound::CSampleHandle::CSampleHandle(&local_7c);
        }
        else {
          wpc = WavpackOpenFileInput
                          ((read_stream)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (char *)this_00);
          if (wpc == (WavpackContext *)0x0) {
            dbg_msg("sound/wv","failed to open %s: %s",in_RSI,local_78);
            iVar5 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
          }
          else {
            uVar2 = WavpackGetNumSamples(wpc);
            uVar3 = WavpackGetBitsPerSample(wpc);
            uVar4 = WavpackGetSampleRate(wpc);
            iVar5 = WavpackGetNumChannels(wpc);
            ::m_aSamples[iVar1].m_Channels = iVar5;
            ::m_aSamples[iVar1].m_Rate = uVar4;
            if (2 < ::m_aSamples[iVar1].m_Channels) {
              dbg_msg("sound/wv","file is not mono or stereo. filename=\'%s\'",in_RSI);
              io_close((IOHANDLE)0x13e5c5);
              s_File = (IOHANDLE)0x0;
              lock_unlock((LOCK)0x13e5dc);
              ISound::CSampleHandle::CSampleHandle(&local_7c);
              goto LAB_0013e7b5;
            }
            if (uVar3 != 0x10) {
              dbg_msg("sound/wv","bps is %d, not 16, filname=\'%s\'",(ulong)uVar3,in_RSI);
              io_close((IOHANDLE)0x13e61c);
              s_File = (IOHANDLE)0x0;
              lock_unlock((LOCK)0x13e633);
              ISound::CSampleHandle::CSampleHandle(&local_7c);
              goto LAB_0013e7b5;
            }
            local_c8 = (undefined4 *)mem_alloc(0);
            WavpackUnpackSamples
                      (in_stack_ffffffffffffff30,
                       (int32_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (uint32_t)((ulong)in_RDI >> 0x20));
            psVar6 = (short *)mem_alloc(0);
            ::m_aSamples[iVar1].m_pData = psVar6;
            psVar6 = ::m_aSamples[iVar1].m_pData;
            for (iVar7 = 0; iVar7 < (int)(uVar2 * iVar5); iVar7 = iVar7 + 1) {
              *psVar6 = (short)*local_c8;
              psVar6 = psVar6 + 1;
              local_c8 = local_c8 + 1;
            }
            mem_free((void *)0x13e6f7);
            iVar5 = (int)((ulong)psVar6 >> 0x20);
            ::m_aSamples[iVar1].m_NumFrames = uVar2;
            ::m_aSamples[iVar1].m_LoopStart = -1;
            ::m_aSamples[iVar1].m_LoopEnd = -1;
            ::m_aSamples[iVar1].m_PausedAt = 0;
          }
          io_close((IOHANDLE)0x13e757);
          s_File = (IOHANDLE)0x0;
          if (in_RDI->m_pConfig->m_Debug != 0) {
            dbg_msg("sound/wv","loaded %s",in_RSI);
          }
          RateConvert(iVar5);
          lock_unlock((LOCK)0x13e7a3);
          local_7c = ISound::CreateSampleHandle(this_00,Index);
        }
      }
    }
  }
  else {
    ISound::CSampleHandle::CSampleHandle(&local_7c);
  }
LAB_0013e7b5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (CSampleHandle)local_7c.m_Id;
  }
  __stack_chk_fail();
}

Assistant:

ISound::CSampleHandle CSound::LoadWV(const char *pFilename)
{
	CSample *pSample;
	int SampleID = -1;
	char aError[100];
	WavpackContext *pContext;

	// don't waste memory on sound when we are stress testing
	if(m_pConfig->m_DbgStress)
		return CSampleHandle();

	// no need to load sound when we are running with no sound
	if(!m_SoundEnabled)
		return CSampleHandle();

	if(!m_pStorage)
		return CSampleHandle();

	lock_wait(m_SoundLock);
	s_File = m_pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!s_File)
	{
		dbg_msg("sound/wv", "failed to open file. filename='%s'", pFilename);
		lock_unlock(m_SoundLock);
		return CSampleHandle();
	}

	SampleID = AllocID();
	if(SampleID < 0)
	{
		io_close(s_File);
		s_File = 0;
		lock_unlock(m_SoundLock);
		return CSampleHandle();
	}
	pSample = &m_aSamples[SampleID];

#if defined(CONF_WAVPACK_OPEN_FILE_INPUT_EX)
	WavpackStreamReader Callback = {0};
	Callback.can_seek = ReturnFalse;
	Callback.get_length = GetLength;
	Callback.get_pos = GetPos;
	Callback.push_back_byte = PushBackByte;
	Callback.read_bytes = ReadData;
	pContext = WavpackOpenFileInputEx(&Callback, (void *)1, 0, aError, 0, 0);
#else
	pContext = WavpackOpenFileInput(ReadDataOld, aError);
#endif
	if (pContext)
	{
		int m_aSamples = WavpackGetNumSamples(pContext);
		int BitsPerSample = WavpackGetBitsPerSample(pContext);
		unsigned int SampleRate = WavpackGetSampleRate(pContext);
		int m_aChannels = WavpackGetNumChannels(pContext);
		int *pData;
		int *pSrc;
		short *pDst;
		int i;

		pSample->m_Channels = m_aChannels;
		pSample->m_Rate = SampleRate;

		if(pSample->m_Channels > 2)
		{
			dbg_msg("sound/wv", "file is not mono or stereo. filename='%s'", pFilename);
			io_close(s_File);
			s_File = 0;
			lock_unlock(m_SoundLock);
			return CSampleHandle();
		}

		/*
		if(snd->rate != 44100)
		{
			dbg_msg("sound/wv", "file is %d Hz, not 44100 Hz. filename='%s'", snd->rate, filename);
			return -1;
		}*/

		if(BitsPerSample != 16)
		{
			dbg_msg("sound/wv", "bps is %d, not 16, filname='%s'", BitsPerSample, pFilename);
			io_close(s_File);
			s_File = 0;
			lock_unlock(m_SoundLock);
			return CSampleHandle();
		}

		pData = (int *)mem_alloc(4*m_aSamples*m_aChannels);
		WavpackUnpackSamples(pContext, pData, m_aSamples); // TODO: check return value
		pSrc = pData;

		pSample->m_pData = (short *)mem_alloc(2*m_aSamples*m_aChannels);
		pDst = pSample->m_pData;

		for (i = 0; i < m_aSamples*m_aChannels; i++)
			*pDst++ = (short)*pSrc++;

		mem_free(pData);

		pSample->m_NumFrames = m_aSamples;
		pSample->m_LoopStart = -1;
		pSample->m_LoopEnd = -1;
		pSample->m_PausedAt = 0;
	}
	else
	{
		dbg_msg("sound/wv", "failed to open %s: %s", pFilename, aError);
	}

	io_close(s_File);
	s_File = NULL;

	if(m_pConfig->m_Debug)
		dbg_msg("sound/wv", "loaded %s", pFilename);

	RateConvert(SampleID);
	lock_unlock(m_SoundLock);
	return CreateSampleHandle(SampleID);
}